

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.cpp
# Opt level: O3

void ReplaceObject(void)

{
  _func_RecyclerTestObject_ptr *p_Var1;
  RecyclerTestObject *value;
  Location LVar2;
  Location local_20;
  
  p_Var1 = WeightedTable<RecyclerTestObject_*(*)()>::GetRandomEntry(&objectCreationTable);
  value = (*p_Var1)();
  LVar2 = GetRandomLocation();
  local_20.location = LVar2.location;
  local_20.type = LVar2.type;
  Location::Set(&local_20,value);
  return;
}

Assistant:

void ReplaceObject()
{
    // Create a new object
    RecyclerTestObject * object = CreateNewObject();
    
    // Walk to a random location in the current object graph
    Location location = GetRandomLocation();

    // Set the new object there unconditionally
    location.Set(object);
}